

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O2

void __thiscall
t_go_generator::generate_deserialize_struct
          (t_go_generator *this,ostream *out,t_struct *tstruct,bool pointer_field,bool declare,
          string *prefix)

{
  ostream *poVar1;
  char *pcVar2;
  undefined3 in_register_00000081;
  string eq;
  string sStack_68;
  string local_48 [32];
  
  pcVar2 = " = ";
  if (CONCAT31(in_register_00000081,declare) != 0) {
    pcVar2 = " := ";
  }
  std::__cxx11::string::string(local_48,pcVar2,(allocator *)&sStack_68);
  t_generator::indent_abi_cxx11_(&sStack_68,&this->super_t_generator);
  poVar1 = std::operator<<(out,(string *)&sStack_68);
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1,local_48);
  pcVar2 = "";
  if (pointer_field) {
    pcVar2 = "&";
  }
  std::operator<<(poVar1,pcVar2);
  std::__cxx11::string::~string((string *)&sStack_68);
  generate_go_struct_initializer(this,out,tstruct,false);
  t_generator::indent_abi_cxx11_(&sStack_68,&this->super_t_generator);
  poVar1 = std::operator<<(out,(string *)&sStack_68);
  poVar1 = std::operator<<(poVar1,"if err := ");
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1,".");
  poVar1 = std::operator<<(poVar1,(string *)&this->read_method_name_);
  poVar1 = std::operator<<(poVar1,"(ctx, iprot); err != nil {");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_68);
  t_generator::indent_abi_cxx11_(&sStack_68,&this->super_t_generator);
  poVar1 = std::operator<<(out,(string *)&sStack_68);
  poVar1 = std::operator<<(poVar1,
                           "  return thrift.PrependError(fmt.Sprintf(\"%T error reading struct: \", "
                          );
  poVar1 = std::operator<<(poVar1,(string *)prefix);
  poVar1 = std::operator<<(poVar1,"), err)");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_68);
  t_generator::indent_abi_cxx11_(&sStack_68,&this->super_t_generator);
  poVar1 = std::operator<<(out,(string *)&sStack_68);
  poVar1 = std::operator<<(poVar1,"}");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void t_go_generator::generate_deserialize_struct(ostream& out,
                                                 t_struct* tstruct,
                                                 bool pointer_field,
                                                 bool declare,
                                                 string prefix) {
  string eq(declare ? " := " : " = ");

  out << indent() << prefix << eq << (pointer_field ? "&" : "");
  generate_go_struct_initializer(out, tstruct);
  out << indent() << "if err := " << prefix << "." << read_method_name_ <<  "(ctx, iprot); err != nil {" << endl;
  out << indent() << "  return thrift.PrependError(fmt.Sprintf(\"%T error reading struct: \", "
      << prefix << "), err)" << endl;
  out << indent() << "}" << endl;
}